

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SetTextEncoding(sqlite3 *db,u8 enc)

{
  CollSeq *pCVar1;
  u8 in_SIL;
  sqlite3 *in_RDI;
  sqlite3 *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  
  in_RDI->enc = in_SIL;
  pCVar1 = sqlite3FindCollSeq(unaff_retaddr,(u8)((ulong)in_RDI >> 0x38),
                              (char *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffec);
  in_RDI->pDfltColl = pCVar1;
  sqlite3ExpirePreparedStatements(in_RDI,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetTextEncoding(sqlite3 *db, u8 enc){
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  db->enc = enc;
  /* EVIDENCE-OF: R-08308-17224 The default collating function for all
  ** strings is BINARY.
  */
  db->pDfltColl = sqlite3FindCollSeq(db, enc, sqlite3StrBINARY, 0);
  sqlite3ExpirePreparedStatements(db, 1);
}